

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O1

int __thiscall
soplex::SPxHarrisRT<double>::maxDelta
          (SPxHarrisRT<double> *this,double *param_1,double *val,int num,int *idx,double *upd,
          double *vec,double *low,double *up)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  double *pdVar4;
  long lVar5;
  Real RVar6;
  double dVar7;
  double dVar8;
  
  this_00 = (this->super_SPxRatioTester<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_SPxRatioTester<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  RVar6 = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  dVar7 = *val;
  if (num != 0) {
    pdVar4 = (double *)__tls_get_addr(&PTR_003b6b60);
    dVar1 = *pdVar4;
    lVar5 = (long)num;
    do {
      iVar3 = idx[lVar5 + -1];
      dVar8 = upd[iVar3];
      if (dVar8 <= RVar6) {
        if (dVar8 < -RVar6) {
          dVar2 = low[iVar3];
          dVar8 = ((dVar2 - vec[iVar3]) - (this->super_SPxRatioTester<double>).delta) / dVar8;
          if ((dVar8 < dVar7) && (::soplex::infinity::__tls_init(), -dVar1 < dVar2))
          goto LAB_002369c6;
        }
      }
      else {
        dVar2 = up[iVar3];
        dVar8 = ((dVar2 - vec[iVar3]) + (this->super_SPxRatioTester<double>).delta) / dVar8;
        if ((dVar8 < dVar7) && (::soplex::infinity::__tls_init(), dVar2 < dVar1)) {
LAB_002369c6:
          dVar7 = dVar8;
        }
      }
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  *val = dVar7;
  return -1;
}

Assistant:

int SPxHarrisRT<R>::maxDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
)  const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val >= 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x < theval && up[i] < R(infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x < theval && low[i] > R(-infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}